

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_JSON.h
# Opt level: O3

string * __thiscall
choc::json::getEscapedQuotedString_abi_cxx11_
          (string *__return_storage_ptr__,json *this,string_view s)

{
  ostringstream result;
  UTF8Pointer local_1b8 [2];
  long local_1a8 [2];
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  local_1b8[0].text._0_1_ = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,(char *)local_1b8,1);
  local_1b8[0].text = (char *)local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,s._M_len,this + s._M_len);
  writeWithEscapeCharacters<std::__cxx11::ostringstream>
            ((basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
             local_1b8[0]);
  if ((long *)local_1b8[0].text != local_1a8) {
    operator_delete(local_1b8[0].text,local_1a8[0] + 1);
  }
  local_1b8[0].text._0_1_ = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,(char *)local_1b8,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

inline std::string getEscapedQuotedString (std::string_view s)
{
    std::ostringstream result;
    result << '"';
    writeWithEscapeCharacters (result, text::UTF8Pointer (std::string (s).c_str()));
    result << '"';
    return result.str();
}